

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader_buffer.c
# Opt level: O3

int16_t aom_rb_read_signed_primitive_refsubexpfin
                  (aom_read_bit_buffer *rb,uint16_t n,uint16_t k,int16_t ref)

{
  short sVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  ushort uVar5;
  short sVar6;
  undefined6 in_register_00000012;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  
  uVar7 = CONCAT62(in_register_00000012,k);
  uVar9 = uVar7 & 0xffffffff;
  uVar5 = (n + ref) - 1;
  uVar13 = (uint)(ushort)(n * 2 - 1);
  iVar11 = 0;
  if (3 << ((byte)uVar9 & 0x1f) < (int)uVar13) {
    uVar10 = uVar7 & 0xffffffff;
    iVar3 = iVar11;
    iVar11 = 0;
    do {
      iVar2 = aom_rb_read_bit(rb);
      if (iVar2 == 0) {
        if ((int)uVar9 < 1) {
          uVar8 = 0;
        }
        else {
          uVar14 = (int)uVar9 + 1;
          uVar8 = 0;
          do {
            iVar3 = aom_rb_read_bit(rb);
            uVar8 = uVar8 | iVar3 << ((char)uVar14 - 2U & 0x1f);
            uVar14 = uVar14 - 1;
          } while (1 < uVar14);
        }
        uVar8 = uVar8 + iVar11;
        goto LAB_0015f345;
      }
      iVar11 = iVar11 + (1 << ((byte)uVar9 & 0x1f));
      bVar4 = (byte)uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
      uVar9 = (ulong)(uint)(iVar3 + (int)uVar7);
      iVar3 = iVar3 + 1;
    } while ((3 << (bVar4 & 0x1f)) + iVar11 < (int)uVar13);
  }
  uVar8 = 0;
  if (1 < (ushort)(uVar13 - iVar11)) {
    uVar14 = uVar13 - iVar11 & 0xffff;
    iVar3 = 0x1f;
    if (uVar14 != 0) {
      for (; uVar14 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    uVar12 = iVar3 + 1;
    do {
      iVar2 = aom_rb_read_bit(rb);
      uVar8 = uVar8 | iVar2 << ((char)uVar12 - 2U & 0x1f);
      uVar12 = uVar12 - 1;
    } while (1 < uVar12);
    iVar3 = (2 << ((byte)iVar3 & 0x1f)) - uVar14;
    if (iVar3 <= (int)uVar8) {
      iVar2 = aom_rb_read_bit(rb);
      uVar8 = (uVar8 * 2 - iVar3) + iVar2;
    }
  }
  uVar8 = uVar8 + iVar11;
LAB_0015f345:
  sVar6 = (short)uVar8;
  if (uVar13 < (uint)uVar5 * 2) {
    sVar1 = n * 2 + -2;
    uVar5 = sVar1 - uVar5;
    uVar13 = uVar8 & 0xffff;
    if (uVar13 <= (uint)uVar5 * 2) {
      if ((uVar8 & 1) == 0) {
        sVar6 = (short)(uVar13 >> 1);
      }
      else {
        sVar6 = -(short)(uVar13 + 1 >> 1);
      }
      sVar6 = uVar5 + sVar6;
    }
    sVar6 = sVar1 - sVar6;
  }
  else {
    uVar13 = uVar8 & 0xffff;
    if (uVar13 <= (uint)uVar5 * 2) {
      if ((uVar8 & 1) == 0) {
        sVar6 = (short)(uVar13 >> 1);
      }
      else {
        sVar6 = -(short)(uVar13 + 1 >> 1);
      }
      sVar6 = uVar5 + sVar6;
    }
  }
  return (sVar6 - n) + 1;
}

Assistant:

int16_t aom_rb_read_signed_primitive_refsubexpfin(
    struct aom_read_bit_buffer *rb, uint16_t n, uint16_t k, int16_t ref) {
  ref += n - 1;
  const uint16_t scaled_n = (n << 1) - 1;
  return aom_rb_read_primitive_refsubexpfin(rb, scaled_n, k, ref) - n + 1;
}